

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::ShaderAtomicOrCase::getInputs
          (ShaderAtomicOrCase *this,int numValues,int stride,void *inputs)

{
  uint uVar1;
  Precision PVar2;
  deUint32 dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  byte bVar10;
  Random rnd;
  deRandom local_40;
  
  dVar3 = deStringHash((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode
                       .m_name._M_dataplus._M_p);
  deRandom_init(&local_40,dVar3);
  iVar4 = (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[0] *
          (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[1];
  uVar1 = (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[2];
  uVar7 = iVar4 * uVar1;
  if (0 < numValues / (int)uVar7) {
    PVar2 = (this->super_ShaderAtomicOpCase).m_precision;
    bVar10 = 0x1f;
    if (PVar2 != PRECISION_HIGHP) {
      bVar10 = (PVar2 == PRECISION_MEDIUMP) * '\b' + 7;
    }
    iVar5 = 0;
    iVar6 = 0;
    do {
      uVar9 = (ulong)uVar7;
      iVar8 = iVar5;
      if (0 < (int)uVar7) {
        do {
          dVar3 = deRandom_getUint32(&local_40);
          *(int *)((long)inputs + (long)iVar8) = 1 << ((byte)dVar3 & bVar10);
          iVar8 = iVar8 + stride;
          uVar9 = uVar9 - 1;
        } while (uVar9 != 0);
      }
      iVar6 = iVar6 + 1;
      iVar5 = iVar5 + iVar4 * uVar1 * stride;
    } while (iVar6 != numValues / (int)uVar7);
  }
  return;
}

Assistant:

void getInputs (int numValues, int stride, void* inputs) const
	{
		de::Random		rnd				(deStringHash(getName()));
		const int		workGroupSize	= (int)product(m_workGroupSize);
		const int		numWorkGroups	= numValues/workGroupSize;
		const int		numBits			= m_precision == PRECISION_HIGHP ? 32 :
										  m_precision == PRECISION_MEDIUMP ? 16 : 8;

		for (int groupNdx = 0; groupNdx < numWorkGroups; groupNdx++)
		{
			const int groupOffset = groupNdx*workGroupSize;

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
				*(deUint32*)((deUint8*)inputs + stride*(groupOffset+localNdx)) = 1u<<rnd.getInt(0, numBits-1);
		}
	}